

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_signed_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian,REF_RECON_RECONSTRUCTION recon)

{
  uint uVar1;
  REF_BOOL *replace_00;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL *replace;
  REF_RECON_RECONSTRUCTION recon_local;
  REF_DBL *hessian_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  if (recon == REF_RECON_L2PROJECTION) {
    uVar1 = ref_recon_l2_projection_hessian(ref_grid,scalar,hessian);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x58b
             ,"ref_recon_signed_hessian",(ulong)uVar1,"l2");
      return uVar1;
    }
    if (ref_grid->node->max * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x58c
             ,"ref_recon_signed_hessian","malloc replace of REF_BOOL negative");
      return 1;
    }
    replace_00 = (REF_BOOL *)malloc((long)(ref_grid->node->max * 6) << 2);
    if (replace_00 == (REF_BOOL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x58c
             ,"ref_recon_signed_hessian","malloc replace of REF_BOOL NULL");
      return 2;
    }
    if (ref_grid->twod == 0) {
      uVar1 = ref_recon_mask_tri(ref_grid,replace_00,6);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x590,"ref_recon_signed_hessian",(ulong)uVar1,"mask tri");
        return uVar1;
      }
    }
    else {
      uVar1 = ref_recon_mask_edg(ref_grid,replace_00,6);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x58e,"ref_recon_signed_hessian",(ulong)uVar1,"mask edg");
        return uVar1;
      }
    }
    uVar1 = ref_recon_skip_orphan_replace(ref_grid,replace_00,6);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x592
             ,"ref_recon_signed_hessian",(ulong)uVar1,"skip orphans");
      return uVar1;
    }
    uVar1 = ref_recon_extrapolate_zeroth(ref_grid,hessian,replace_00,6);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x594
             ,"ref_recon_signed_hessian",(ulong)uVar1,"bound extrap");
      return uVar1;
    }
    if (replace_00 != (REF_BOOL *)0x0) {
      free(replace_00);
    }
  }
  else {
    if (recon != REF_RECON_KEXACT) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x59d
             ,"ref_recon_signed_hessian","reconstruction not available");
      return 1;
    }
    uVar1 = ref_recon_kexact_gradient_hessian(ref_grid,scalar,(REF_DBL *)0x0,hessian);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x599
             ,"ref_recon_signed_hessian",(ulong)uVar1,"k-exact");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_recon_signed_hessian(REF_GRID ref_grid, REF_DBL *scalar,
                                            REF_DBL *hessian,
                                            REF_RECON_RECONSTRUCTION recon) {
  REF_BOOL *replace;

  switch (recon) {
    case REF_RECON_L2PROJECTION:
      RSS(ref_recon_l2_projection_hessian(ref_grid, scalar, hessian), "l2");
      ref_malloc(replace, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_BOOL);
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_recon_mask_edg(ref_grid, replace, 6), "mask edg");
      } else {
        RSS(ref_recon_mask_tri(ref_grid, replace, 6), "mask tri");
      }
      RSS(ref_recon_skip_orphan_replace(ref_grid, replace, 6), "skip orphans");
      RSS(ref_recon_extrapolate_zeroth(ref_grid, hessian, replace, 6),
          "bound extrap");
      ref_free(replace);
      break;
    case REF_RECON_KEXACT:
      RSS(ref_recon_kexact_gradient_hessian(ref_grid, scalar, NULL, hessian),
          "k-exact");
      break;
    case REF_RECON_LAST:
    default:
      THROW("reconstruction not available");
  }

  return REF_SUCCESS;
}